

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Dial.cxx
# Opt level: O1

void __thiscall Fl_Dial::draw(Fl_Dial *this)

{
  draw(this,(this->super_Fl_Valuator).super_Fl_Widget.x_,
       (this->super_Fl_Valuator).super_Fl_Widget.y_,(this->super_Fl_Valuator).super_Fl_Widget.w_,
       (this->super_Fl_Valuator).super_Fl_Widget.h_);
  Fl_Widget::draw_label((Fl_Widget *)this);
  return;
}

Assistant:

void Fl_Dial::draw() {
  draw(x(), y(), w(), h());
  draw_label();
}